

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license++.cpp
# Opt level: O3

void mergeLicenses(vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                   *licenses,LicenseInfo *license)

{
  time_t tVar1;
  time_t tVar2;
  pointer this;
  
  if ((license != (LicenseInfo *)0x0) &&
     (this = (licenses->
             super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
             )._M_impl.super__Vector_impl_data._M_start,
     this != (licenses->
             super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish)) {
    tVar2 = 0;
    do {
      if (this->has_expiry == false) {
        ::license::FullLicenseInfo::toLicenseInfo(this,license);
        return;
      }
      tVar1 = ::license::FullLicenseInfo::expires_on(this);
      if (tVar2 < tVar1) {
        tVar2 = ::license::FullLicenseInfo::expires_on(this);
        ::license::FullLicenseInfo::toLicenseInfo(this,license);
      }
      this = this + 1;
    } while (this != (licenses->
                     super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

static void mergeLicenses(vector<license::FullLicenseInfo> licenses,
		LicenseInfo* license) {
	if (license != NULL) {
		time_t curLicense_exp = 0;
		for (auto it = licenses.begin(); it != licenses.end(); it++) {
			//choose the license that expires later...
			if (!it->has_expiry) {
				it->toLicenseInfo(license);
				break;
			} else if (curLicense_exp < it->expires_on()) {
				curLicense_exp = it->expires_on();
				it->toLicenseInfo(license);
			}
		}
	}
}